

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::CodeHolder::bindLabel
          (CodeHolder *this,Label *label,uint32_t toSectionId,uint64_t toOffset)

{
  uint32_t uVar1;
  ulong uVar2;
  RelocEntry *pRVar3;
  bool bVar4;
  LabelEntry **ppLVar5;
  Section **ppSVar6;
  LabelLink *pLVar7;
  RelocEntry **ppRVar8;
  long lVar9;
  uint64_t in_RCX;
  uint in_EDX;
  long in_RSI;
  void *in_RDI;
  int64_t displacement;
  RelocEntry *re;
  uint32_t relocId;
  size_t linkOffset;
  uint32_t linkSectionId;
  LabelLinkIterator link;
  CodeBuffer *buf;
  Error err;
  Section *section;
  LabelEntry *le;
  char *in_stack_000002d0;
  int in_stack_000002dc;
  char *in_stack_000002e0;
  CodeHolder *in_stack_fffffffffffffed8;
  LabelLinkIterator *in_stack_fffffffffffffee0;
  ZoneVector<asmjit::v1_14::Section_*> *in_stack_fffffffffffffee8;
  LabelEntry *format;
  void *pvVar10;
  LabelLinkIterator local_c8;
  CodeBuffer *local_b8;
  Error local_ac;
  Section *local_a8;
  LabelEntry *local_a0;
  uint64_t local_98;
  uint local_8c;
  Error local_74;
  CodeBuffer *local_70;
  CodeBuffer *local_68;
  long local_60;
  LabelEntry *local_58;
  Section *local_50;
  OffsetFormat *local_38;
  uint local_2c;
  uint local_14;
  long local_8;
  
  local_2c = *(uint *)(in_RSI + 4);
  local_8 = (long)in_RDI + 0xf8;
  pvVar10 = in_RDI;
  local_98 = in_RCX;
  local_8c = in_EDX;
  local_14 = local_2c;
  if (local_2c < *(uint *)((long)in_RDI + 0x100)) {
    ppLVar5 = ZoneVector<asmjit::v1_14::LabelEntry_*>::operator[]
                        ((ZoneVector<asmjit::v1_14::LabelEntry_*> *)in_stack_fffffffffffffee8,
                         (size_t)in_stack_fffffffffffffee0);
    format = *ppLVar5;
  }
  else {
    format = (LabelEntry *)0x0;
  }
  local_a0 = format;
  if (format == (LabelEntry *)0x0) {
    local_74 = DebugUtils::errored(0xc);
  }
  else {
    local_60 = (long)in_RDI + 0xd8;
    if (*(uint *)((long)in_RDI + 0xe0) < local_8c) {
      local_74 = DebugUtils::errored(0x13);
    }
    else {
      local_58 = format;
      if (format->_section == (Section *)0x0) {
        ppSVar6 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                            (in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0);
        local_a8 = *ppSVar6;
        local_a0->_section = local_a8;
        local_a0->_offset = local_98;
        local_ac = 0;
        local_b8 = &local_a8->_buffer;
        local_50 = local_a8;
        LabelLinkIterator::LabelLinkIterator
                  (in_stack_fffffffffffffee0,(LabelEntry *)in_stack_fffffffffffffed8);
        while (bVar4 = LabelLinkIterator::operator_cast_to_bool((LabelLinkIterator *)0x11c8ae),
              bVar4) {
          pLVar7 = LabelLinkIterator::operator->(&local_c8);
          uVar1 = pLVar7->sectionId;
          pLVar7 = LabelLinkIterator::operator->(&local_c8);
          uVar2 = pLVar7->offset;
          pLVar7 = LabelLinkIterator::operator->(&local_c8);
          if (pLVar7->relocId == 0xffffffff) {
            if (uVar1 == local_8c) {
              local_68 = local_b8;
              if (local_b8->_size <= uVar2) {
                DebugUtils::assertionFailed(in_stack_000002e0,in_stack_000002dc,in_stack_000002d0);
              }
              lVar9 = local_98 - uVar2;
              pLVar7 = LabelLinkIterator::operator->(&local_c8);
              in_stack_fffffffffffffee0 = (LabelLinkIterator *)(lVar9 + pLVar7->rel);
              local_70 = local_b8;
              in_stack_fffffffffffffee8 =
                   (ZoneVector<asmjit::v1_14::Section_*> *)(local_b8->_size - uVar2);
              pLVar7 = LabelLinkIterator::operator->(&local_c8);
              local_38 = &pLVar7->format;
              if (in_stack_fffffffffffffee8 <
                  (ZoneVector<asmjit::v1_14::Section_*> *)(ulong)(pLVar7->format)._regionSize) {
                DebugUtils::assertionFailed(in_stack_000002e0,in_stack_000002dc,in_stack_000002d0);
              }
              in_stack_fffffffffffffed8 = (CodeHolder *)(local_b8->_data + uVar2);
              LabelLinkIterator::operator->(&local_c8);
              bVar4 = CodeWriterUtils::writeOffset(pvVar10,(int64_t)in_RDI,(OffsetFormat *)format);
              if (bVar4) goto LAB_0011caa1;
              local_ac = DebugUtils::errored(0x30);
              LabelLinkIterator::next(&local_c8);
            }
            else {
              LabelLinkIterator::next(&local_c8);
            }
          }
          else {
            ppRVar8 = ZoneVector<asmjit::v1_14::RelocEntry_*>::operator[]
                                ((ZoneVector<asmjit::v1_14::RelocEntry_*> *)
                                 in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0);
            pRVar3 = *ppRVar8;
            pRVar3->_payload = local_98 + pRVar3->_payload;
            pRVar3->_targetSectionId = local_8c;
LAB_0011caa1:
            LabelLinkIterator::resolveAndNext(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          }
        }
        local_74 = local_ac;
      }
      else {
        local_74 = DebugUtils::errored(0xe);
      }
    }
  }
  return local_74;
}

Assistant:

ASMJIT_API Error CodeHolder::bindLabel(const Label& label, uint32_t toSectionId, uint64_t toOffset) noexcept {
  LabelEntry* le = labelEntry(label);
  if (ASMJIT_UNLIKELY(!le))
    return DebugUtils::errored(kErrorInvalidLabel);

  if (ASMJIT_UNLIKELY(toSectionId > _sections.size()))
    return DebugUtils::errored(kErrorInvalidSection);

  // Label can be bound only once.
  if (ASMJIT_UNLIKELY(le->isBound()))
    return DebugUtils::errored(kErrorLabelAlreadyBound);

  // Bind the label.
  Section* section = _sections[toSectionId];
  le->_section = section;
  le->_offset = toOffset;

  Error err = kErrorOk;
  CodeBuffer& buf = section->buffer();

  // Fix all links to this label we have collected so far if they are within
  // the same section. We ignore any inter-section links as these have to be
  // fixed later.
  LabelLinkIterator link(le);
  while (link) {
    uint32_t linkSectionId = link->sectionId;
    size_t linkOffset = link->offset;

    uint32_t relocId = link->relocId;
    if (relocId != Globals::kInvalidId) {
      // Adjust relocation data only.
      RelocEntry* re = _relocations[relocId];
      re->_payload += toOffset;
      re->_targetSectionId = toSectionId;
    }
    else {
      if (linkSectionId != toSectionId) {
        link.next();
        continue;
      }

      ASMJIT_ASSERT(linkOffset < buf.size());
      int64_t displacement = int64_t(toOffset - uint64_t(linkOffset) + uint64_t(int64_t(link->rel)));

      // Size of the value we are going to patch. Only BYTE/DWORD is allowed.
      ASMJIT_ASSERT(buf.size() - size_t(linkOffset) >= link->format.regionSize());

      // Overwrite a real displacement in the CodeBuffer.
      if (!CodeWriterUtils::writeOffset(buf._data + linkOffset, displacement, link->format)) {
        err = DebugUtils::errored(kErrorInvalidDisplacement);
        link.next();
        continue;
      }
    }

    link.resolveAndNext(this);
  }

  return err;
}